

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void keep_least_weights(vector<double,_std::allocator<double>_> *old_weights,
                       vector<double,_std::allocator<double>_> *new_weights)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  ulong uVar5;
  
  pdVar2 = (old_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(old_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if (lVar4 != 0) {
    pdVar3 = (new_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      dVar1 = pdVar3[uVar5];
      if (dVar1 < pdVar2[uVar5]) {
        pdVar2[uVar5] = dVar1;
      }
      uVar5 = uVar5 + 1;
    } while ((uVar5 & 0xffffffff) < (ulong)(lVar4 >> 3));
  }
  return;
}

Assistant:

void keep_least_weights(std::vector<double>& old_weights, const std::vector<double>& new_weights){
    // std::cout<<" dbg size comparison: "<<old_weights.size()<<" vs "<<new_weights.size()<<'\n';
    // std::cout<<" dbg new weights: ";
    for(unsigned i=0;i<old_weights.size();++i){
        // std::cout<<" \ndbg check if "<<old_weights[i]<<" > "<<new_weights[i]<<" ? => ";
        if(old_weights[i]>new_weights[i]){
            old_weights[i]=new_weights[i];
        }
        // std::cout<<old_weights[i]<<" ";
    }
    // std::cout<<'\n';
}